

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O3

MPP_RET __thiscall MppClusterServer::put(MppClusterServer *this,MppClientType client_type)

{
  MppCluster *ptr;
  MPP_RET MVar1;
  long lVar2;
  long lVar3;
  
  MVar1 = MPP_NOK;
  if ((int)client_type < 0x1e) {
    pthread_mutex_lock((pthread_mutex_t *)this);
    ptr = this->mClusters[client_type];
    if (ptr == (MppCluster *)0x0) {
      MVar1 = MPP_NOK;
    }
    else {
      if (0 < ptr->worker_count) {
        lVar3 = 0;
        lVar2 = 0;
        do {
          cluster_worker_deinit((ClusterWorker *)(ptr->worker->name + lVar3));
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x58;
        } while (lVar2 < ptr->worker_count);
      }
      if (((byte)mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","put %s\n",(char *)0x0,ptr);
      }
      mpp_osal_free("put",ptr);
      MVar1 = MPP_OK;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return MVar1;
}

Assistant:

MPP_RET MppClusterServer::put(MppClientType client_type)
{
    RK_S32 i;

    if (client_type >= VPU_CLIENT_BUTT)
        return MPP_NOK;

    AutoMutex auto_lock(this);
    MppCluster *p = mClusters[client_type];

    if (!p)
        return MPP_NOK;

    for (i = 0; i < p->worker_count; i++)
        cluster_worker_deinit(&p->worker[i]);

    cluster_dbg_flow("put %s\n", p->name);

    mpp_free(p);

    return MPP_OK;
}